

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ReportPropertyOrigin
          (cmGeneratorTarget *this,string *p,string *result,string *report,string *compatibilityType
          )

{
  bool bVar1;
  cmMakefile *this_00;
  mapped_type *pmVar2;
  string *args_2;
  cmake *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  cmAlphaNum local_b8;
  string areport;
  cmAlphaNum local_60;
  
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  debugProperties.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = cmTarget::GetMakefile(this->Target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"CMAKE_DEBUG_TARGET_PROPERTIES",(allocator<char> *)&local_60);
  cmMakefile::GetDefExpandList(this_00,(string *)&local_b8,&debugProperties,false);
  std::__cxx11::string::~string((string *)&local_b8);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           ::operator[](&this->DebugCompatiblePropertiesDone,p);
  if (*pmVar2 == false) {
    bVar1 = ::cm::
            contains<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&debugProperties,p);
  }
  else {
    bVar1 = false;
  }
  if (this->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[](&this->DebugCompatiblePropertiesDone,p);
    *pmVar2 = true;
  }
  if (bVar1 != false) {
    local_b8.View_._M_str = (compatibilityType->_M_dataplus)._M_p;
    local_b8.View_._M_len = compatibilityType->_M_string_length;
    local_60.View_._M_len = 0xe;
    local_60.View_._M_str = " of property \"";
    args_2 = GetName_abi_cxx11_(this);
    cmStrCat<std::__cxx11::string,char[15],std::__cxx11::string,char[13],std::__cxx11::string,char[5],std::__cxx11::string>
              (&areport,&local_b8,&local_60,p,(char (*) [15])"\" for target \"",args_2,
               (char (*) [13])"\" (result: \"",result,(char (*) [5])0x65a6db,report);
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    local_b8.View_._M_len = 0;
    local_b8.View_._M_str = (char *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
              ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_b8);
    cmake::IssueMessage(this_01,LOG,&areport,(cmListFileBacktrace *)&local_b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_b8.View_._M_str);
    std::__cxx11::string::~string((string *)&areport);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&debugProperties);
  return;
}

Assistant:

void cmGeneratorTarget::ReportPropertyOrigin(
  const std::string& p, const std::string& result, const std::string& report,
  const std::string& compatibilityType) const
{
  std::vector<std::string> debugProperties;
  this->Target->GetMakefile()->GetDefExpandList(
    "CMAKE_DEBUG_TARGET_PROPERTIES", debugProperties);

  bool debugOrigin = !this->DebugCompatiblePropertiesDone[p] &&
    cm::contains(debugProperties, p);

  if (this->GlobalGenerator->GetConfigureDoneCMP0026()) {
    this->DebugCompatiblePropertiesDone[p] = true;
  }
  if (!debugOrigin) {
    return;
  }

  std::string areport =
    cmStrCat(compatibilityType, " of property \"", p, "\" for target \"",
             this->GetName(), "\" (result: \"", result, "\"):\n", report);

  this->LocalGenerator->GetCMakeInstance()->IssueMessage(MessageType::LOG,
                                                         areport);
}